

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O0

uint trng::lcg64_shift::log2_floor(result_type x)

{
  uint y;
  result_type x_local;
  
  y = 0;
  for (x_local = x; x_local != 0; x_local = x_local >> 1) {
    y = y + 1;
  }
  return y - 1;
}

Assistant:

TRNG_CUDA_ENABLE
  inline unsigned int lcg64_shift::log2_floor(lcg64_shift::result_type x) {
    unsigned int y{0};
    while (x > 0) {
      x >>= 1u;
      ++y;
    }
    --y;
    return y;
  }